

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void absl::lts_20250127::crc_internal::anon_unknown_0::PolyMultiply
               (uint32_t *val,uint32_t m,uint32_t poly)

{
  undefined4 local_28;
  uint32_t one;
  uint32_t onebit;
  uint32_t result;
  uint32_t l;
  uint32_t poly_local;
  uint32_t m_local;
  uint32_t *val_local;
  
  one = 0;
  l = m;
  for (local_28 = 0x80000000; local_28 != 0; local_28 = local_28 >> 1) {
    if ((*val & local_28) != 0) {
      one = l ^ one;
    }
    if ((l & 1) == 0) {
      l = l >> 1;
    }
    else {
      l = l >> 1 ^ poly;
    }
  }
  *val = one;
  return;
}

Assistant:

void PolyMultiply(uint32_t* val, uint32_t m, uint32_t poly) {
  uint32_t l = *val;
  uint32_t result = 0;
  auto onebit = uint32_t{0x80000000u};
  for (uint32_t one = onebit; one != 0; one >>= 1) {
    if ((l & one) != 0) {
      result ^= m;
    }
    if (m & 1) {
      m = (m >> 1) ^ poly;
    } else {
      m >>= 1;
    }
  }
  *val = result;
}